

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void av1_extend_frame(uint8_t *data,int width,int height,int stride,int border_horz,int border_vert,
                     int highbd)

{
  undefined2 *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  uint8_t *puVar10;
  ulong uVar11;
  void *__src;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t __n;
  bool bVar16;
  
  if (highbd == 0) {
    lVar14 = (long)stride;
    sVar12 = (size_t)border_horz;
    uVar4 = 0;
    pbVar5 = data;
    if (0 < height) {
      uVar4 = (ulong)(uint)height;
    }
    while (bVar16 = uVar4 != 0, uVar4 = uVar4 - 1, bVar16) {
      memset(pbVar5 + -sVar12,(uint)*pbVar5,sVar12);
      memset(pbVar5 + width,(uint)pbVar5[(long)width + -1],sVar12);
      pbVar5 = pbVar5 + lVar14;
    }
    uVar3 = -border_vert;
    __n = (size_t)(width + border_horz * 2);
    uVar4 = 0;
    if (border_vert < 0) {
      uVar4 = (ulong)uVar3;
    }
    puVar10 = data + (lVar14 * (int)uVar3 - sVar12);
    lVar6 = uVar4 - (long)(int)uVar3;
    while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
      memcpy(puVar10,data + -sVar12,__n);
      puVar10 = puVar10 + lVar14;
    }
    lVar6 = (long)height;
    puVar10 = data + (lVar14 * lVar6 - sVar12);
    for (; lVar6 < border_vert + height; lVar6 = lVar6 + 1) {
      memcpy(puVar10,data + -sVar12 + (height + -1) * lVar14,__n);
      puVar10 = puVar10 + lVar14;
    }
  }
  else {
    lVar14 = (long)data * 2;
    lVar6 = (long)stride;
    uVar4 = 0;
    uVar8 = 0;
    if (border_horz < 0) {
      uVar8 = (ulong)(uint)-border_horz;
    }
    uVar11 = 0;
    if (0 < height) {
      uVar11 = (ulong)(uint)height;
    }
    lVar2 = lVar6 * 2;
    lVar15 = lVar14;
    for (; uVar4 != uVar11; uVar4 = uVar4 + 1) {
      puVar1 = (undefined2 *)(lVar14 + uVar4 * lVar6 * 2);
      for (uVar7 = (long)-border_horz; lVar13 = (long)width, uVar8 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined2 *)(lVar15 + uVar7 * 2) = *puVar1;
      }
      for (; lVar13 < border_horz + width; lVar13 = lVar13 + 1) {
        *(undefined2 *)(lVar15 + lVar13 * 2) = puVar1[(long)width + -1];
      }
      lVar15 = lVar15 + lVar2;
    }
    lVar15 = (long)border_horz;
    __src = (void *)(lVar14 + lVar15 * -2);
    uVar3 = -border_vert;
    sVar12 = (long)(width + border_horz * 2) * 2;
    uVar4 = 0;
    if (border_vert < 0) {
      uVar4 = (ulong)uVar3;
    }
    pvVar9 = (void *)(lVar6 * (int)uVar3 * 2 + lVar15 * -2 + lVar14);
    lVar13 = uVar4 - (long)(int)uVar3;
    while (bVar16 = lVar13 != 0, lVar13 = lVar13 + -1, bVar16) {
      memcpy(pvVar9,__src,sVar12);
      pvVar9 = (void *)((long)pvVar9 + lVar2);
    }
    lVar13 = (long)height;
    pvVar9 = (void *)(lVar14 + lVar6 * lVar13 * 2 + lVar15 * -2);
    for (; lVar13 < border_vert + height; lVar13 = lVar13 + 1) {
      memcpy(pvVar9,(void *)((height + -1) * lVar6 * 2 + (long)__src),sVar12);
      pvVar9 = (void *)((long)pvVar9 + lVar2);
    }
  }
  return;
}

Assistant:

void av1_extend_frame(uint8_t *data, int width, int height, int stride,
                      int border_horz, int border_vert, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    extend_frame_highbd(CONVERT_TO_SHORTPTR(data), width, height, stride,
                        border_horz, border_vert);
    return;
  }
#endif
  (void)highbd;
  extend_frame_lowbd(data, width, height, stride, border_horz, border_vert);
}